

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextWrappedV(char *fmt,__va_list_tag *args)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  bool need_backup;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  
  pIVar4 = GetCurrentWindow();
  pfVar1 = &(pIVar4->DC).TextWrapPos;
  bVar2 = *pfVar1 != 0.0;
  bVar3 = *pfVar1 <= 0.0;
  if (bVar3 && bVar2) {
    PushTextWrapPos(0.0);
  }
  TextV(fmt,args);
  if (bVar3 && bVar2) {
    PopTextWrapPos();
  }
  return;
}

Assistant:

void ImGui::TextWrappedV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    bool need_backup = (window->DC.TextWrapPos < 0.0f);  // Keep existing wrap position if one is already set
    if (need_backup)
        PushTextWrapPos(0.0f);
    TextV(fmt, args);
    if (need_backup)
        PopTextWrapPos();
}